

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_1lin.cpp
# Opt level: O0

int r6pSingleLin(MatrixXd *X,MatrixXd *u,MatrixXd *ud,int direction,double r0,int maxpow,
                RSSinglelinCameraPoseVector *results)

{
  double dVar1;
  Scalar *pSVar2;
  CoeffReturnType pdVar3;
  int in_ECX;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_R9;
  double in_XMM0_Qa;
  Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  SVar4;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar5;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0> PVar6;
  Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  SVar7;
  VectorXd wCt;
  Matrix<double,_3,_9,_0,_3,_9> temp;
  double dr;
  int k;
  VectorXd b;
  MatrixXd A;
  Vector3d eax;
  AngleAxis<double> eaxn;
  Vector4d q;
  Matrix3d R;
  int j_4;
  MatrixXcd sols;
  int j_3;
  int nroots;
  double roots [64];
  double proots [65];
  int order;
  double p [65];
  int j_2;
  MatrixXd AM;
  int AM_ind [64];
  int j_1;
  MatrixXd RR;
  MatrixXd alpha;
  MatrixXd C1;
  MatrixXd C0;
  int j;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> data;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  v;
  double solver_input [2475];
  MatrixXd CC;
  VectorXd coeffs;
  double *in_stack_00013d60;
  double in_stack_00013d68;
  double *in_stack_00013d70;
  double *in_stack_00013d78;
  double *in_stack_00013d80;
  value_type *in_stack_ffffffffffff9ea8;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffff9eb0;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffff9eb8;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffff9ec0;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>_>
  *in_stack_ffffffffffff9ec8;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffff9ed0;
  CoeffReturnType in_stack_ffffffffffff9ed8;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffff9ee0;
  CoeffReturnType in_stack_ffffffffffff9ee8;
  StorageBaseType *in_stack_ffffffffffff9ef0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffff9ef8;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_ffffffffffff9f08;
  CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *in_stack_ffffffffffff9f10;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_5f68 [24];
  undefined1 local_5f50 [48];
  Index local_5f20;
  RealScalar local_5f18;
  Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_5ed0;
  undefined8 local_5e60;
  undefined8 local_5d78;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *local_5d10;
  RhsNested local_5d08;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_5cb8;
  double local_5c48;
  double in_stack_ffffffffffffa440;
  double (*in_stack_ffffffffffffa448) [65];
  MatrixXd *in_stack_ffffffffffffa450;
  int local_5b18;
  AngleAxis<double> local_5aa8 [7];
  int local_59b4;
  undefined4 local_597c;
  int local_5960;
  int local_595c;
  undefined8 auStack_5568 [4];
  int local_5544;
  undefined8 local_5528 [79];
  int local_52ac;
  undefined4 local_52a8;
  undefined4 local_52a4;
  undefined1 local_5288 [516];
  int local_5084;
  undefined4 local_5080;
  undefined4 local_507c;
  Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_5018;
  Scalar local_4e30;
  int local_4e28;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_4e00 [823];
  MatrixXd *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff44;
  double *in_stack_ffffffffffffff48;
  
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffff9ec0,
             (int *)in_stack_ffffffffffff9eb8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_ffffffffffff9eb8,(Index)in_stack_ffffffffffff9eb0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&in_stack_ffffffffffff9eb0->m_lu,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_ffffffffffff9ea8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xf3459c);
  if (in_ECX == 0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0xf345b7);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0xf345ce);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0xf345e5);
    R6P_cayley_linearized_prepare_data_C
              (in_stack_00013d80,in_stack_00013d78,in_stack_00013d70,in_stack_00013d68,
               in_stack_00013d60);
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0xf34661);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0xf34678);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0xf3468f);
    R6P_cayley_linearized_prepare_data_y_C
              (in_stack_00013d80,in_stack_00013d78,in_stack_00013d70,in_stack_00013d68,
               in_stack_00013d60);
  }
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_ffffffffffff9eb0);
  Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_ffffffffffff9ed0,(PointerArgType)in_stack_ffffffffffff9ec8,
             (Index)in_stack_ffffffffffff9ec0,(Index)in_stack_ffffffffffff9eb8,
             (Stride<0,_0> *)in_stack_ffffffffffff9eb0);
  for (local_4e28 = 0; local_4e28 < 0xf; local_4e28 = local_4e28 + 1) {
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::row((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
           *)in_stack_ffffffffffff9eb8,(Index)in_stack_ffffffffffff9eb0);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>_>
    ::cwiseAbs(in_stack_ffffffffffff9ec8);
    local_4e30 = Eigen::
                 DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>_>_>
                 ::mean((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>_>_>
                         *)in_stack_ffffffffffff9ec0);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::row((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
           *)in_stack_ffffffffffff9eb8,(Index)in_stack_ffffffffffff9eb0);
    Eigen::
    DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>_>
    ::operator/=((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>_>
                  *)in_stack_ffffffffffff9ee0,in_stack_ffffffffffff9ed8);
  }
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
            (&in_stack_ffffffffffff9eb0->m_lu,
             (EigenBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_ffffffffffff9ea8);
  computeCoeffs((MatrixXd *)solver_input[0x96],(VectorXd *)solver_input[0x95]);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xf34811);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffff9eb0,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffff9ea8);
  setupEliminationTemplate
            ((VectorXd *)in_stack_ffffffffffff9ec0,(MatrixXd *)in_stack_ffffffffffff9eb8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xf3484c);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::leftCols<int>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffff9ed0,
             (int)((ulong)in_stack_ffffffffffff9ec8 >> 0x20));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
            (&in_stack_ffffffffffff9eb0->m_lu,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_> *)
             in_stack_ffffffffffff9ea8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rightCols<int>
            (in_stack_ffffffffffff9ee0,(int)((ulong)in_stack_ffffffffffff9ed8 >> 0x20));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
            (&in_stack_ffffffffffff9eb0->m_lu,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_> *)
             in_stack_ffffffffffff9ea8);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::partialPivLu
            (in_stack_ffffffffffff9eb8);
  SVar4 = Eigen::SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
          solve<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     in_stack_ffffffffffff9ec0,in_stack_ffffffffffff9eb8);
  local_5018 = SVar4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&in_stack_ffffffffffff9eb0->m_lu,
             (EigenBase<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_ffffffffffff9ea8);
  Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU
            (in_stack_ffffffffffff9eb0);
  local_507c = 0x55;
  local_5080 = 0x40;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (&in_stack_ffffffffffff9ed0->m_qr,(int *)in_stack_ffffffffffff9ec8,
             (int *)in_stack_ffffffffffff9ec0);
  for (local_5084 = 0; local_5084 < 0x15; local_5084 = local_5084 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (in_stack_ffffffffffff9ec0,(Index)in_stack_ffffffffffff9eb8);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    operator-((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
              in_stack_ffffffffffff9ec8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (in_stack_ffffffffffff9ec0,(Index)in_stack_ffffffffffff9eb8);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
               in_stack_ffffffffffff9eb0,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                *)in_stack_ffffffffffff9ea8);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((Index)in_stack_ffffffffffff9ed8,(Index)in_stack_ffffffffffff9ed0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::bottomRows<int>
            (in_stack_ffffffffffff9ee0,(int)((ulong)in_stack_ffffffffffff9ed8 >> 0x20));
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
             in_stack_ffffffffffff9eb0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_ffffffffffff9ea8);
  memcpy(local_5288,&DAT_01078850,0x100);
  local_52a4 = 0x40;
  local_52a8 = 0x40;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (&in_stack_ffffffffffff9ed0->m_qr,(int *)in_stack_ffffffffffff9ec8,
             (int *)in_stack_ffffffffffff9ec0);
  for (local_52ac = 0; local_52ac < 0x40; local_52ac = local_52ac + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (in_stack_ffffffffffff9ec0,(Index)in_stack_ffffffffffff9eb8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (in_stack_ffffffffffff9ec0,(Index)in_stack_ffffffffffff9eb8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
               in_stack_ffffffffffff9eb0,
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
               in_stack_ffffffffffff9ea8);
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&in_stack_ffffffffffff9eb0->m_lu,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffff9ea8);
  charpoly_danilevsky(in_stack_ffffffffffffa450,in_stack_ffffffffffffa448,in_stack_ffffffffffffa440)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xf34c60);
  local_5544 = 0x40;
  for (local_5960 = 0; local_5960 <= local_5544; local_5960 = local_5960 + 1) {
    auStack_5568[(long)(local_5544 - local_5960) + -0x3e] = local_5528[local_5960];
  }
  find_real_roots_sturm
            ((double *)solver_input[0x237],solver_input[0x236]._4_4_,(double *)solver_input[0x235],
             (int *)solver_input[0x234],solver_input[0x233]._4_4_,solver_input[0x233]._3_1_);
  local_597c = 3;
  Eigen::Matrix<std::complex<double>,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<std::complex<double>,__1,__1,_0,__1,__1> *)in_stack_ffffffffffff9ed0,
             (int *)in_stack_ffffffffffff9ec8,(int *)in_stack_ffffffffffff9ec0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&in_stack_ffffffffffff9eb0->m_lu,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffff9ea8);
  solve_xy_from_AM(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator=((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)in_stack_ffffffffffff9ec0,
              (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)in_stack_ffffffffffff9eb8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_ffffffffffff9ec0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xf34dce);
  SVar7.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffff9ec8;
  SVar7.m_dec = in_stack_ffffffffffff9ed0;
  for (local_59b4 = 0; local_59b4 < local_595c; local_59b4 = local_59b4 + 1) {
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xf34dfa);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0xf34e09);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
    *pSVar2 = 1.0;
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](local_4e00,(long)local_59b4);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::segment<int>
              ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)SVar7.m_dec,(Index)SVar7.m_rhs,
               (int)((ulong)in_stack_ffffffffffff9ec0 >> 0x20));
    Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *)
               in_stack_ffffffffffff9eb0,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffff9ea8);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::normalize
              ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_ffffffffffff9eb8);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
              ((Matrix<double,_4,_1,_0,_4,_1> *)in_stack_ffffffffffff9eb0,
               (Matrix<double,_4,_1,_0,_4,_1> *)in_stack_ffffffffffff9ea8);
    quat2R((Vector4d *)SVar4.m_dec,(Matrix3d *)SVar4.m_rhs);
    Eigen::AngleAxis<double>::AngleAxis<Eigen::Matrix<double,3,3,0,3,3>>
              ((AngleAxis<double> *)in_stack_ffffffffffff9eb0,
               (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffff9ea8);
    Eigen::AngleAxis<double>::axis(local_5aa8);
    Eigen::AngleAxis<double>::angle(local_5aa8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
              (in_stack_ffffffffffff9ef8,(double *)in_stack_ffffffffffff9ef0);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff9eb0,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_ffffffffffff9ea8);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              (&(SVar7.m_dec)->m_qr,(int *)SVar7.m_rhs,(int *)in_stack_ffffffffffff9ec0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffff9ec0,
               (int *)in_stack_ffffffffffff9eb8);
    for (local_5b18 = 0; local_5b18 < 6; local_5b18 = local_5b18 + 1) {
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                          in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      dVar1 = *pdVar3;
      Eigen::Matrix<double,_3,_9,_0,_3,_9>::Matrix((Matrix<double,_3,_9,_0,_3,_9> *)0xf35016);
      local_5c48 = -(dVar1 - in_XMM0_Qa);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                 in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                 in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                 in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff9ee0,
                 in_stack_ffffffffffff9ed8,(Scalar *)SVar7.m_dec,(Scalar *)SVar7.m_rhs);
      PVar5 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_ffffffffffff9eb0,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_ffffffffffff9ea8);
      local_5cb8 = PVar5;
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff9eb0,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)in_stack_ffffffffffff9ea8);
      X_((Vector3d *)SVar4.m_rhs);
      Eigen::operator*((double *)in_stack_ffffffffffff9ef8,in_stack_ffffffffffff9ef0);
      Eigen::DenseBase<Eigen::Matrix<double,3,9,0,3,9>>::operator<<
                ((DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffff9eb8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                  *)in_stack_ffffffffffff9eb0);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
      Eigen::CommaInitializer<Eigen::Matrix<double,3,9,0,3,9>>::operator_
                (in_stack_ffffffffffff9f10,in_stack_ffffffffffff9f08);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
      Eigen::operator*((double *)in_stack_ffffffffffff9ef8,
                       (StorageBaseType *)in_stack_ffffffffffff9ef0);
      Eigen::CommaInitializer<Eigen::Matrix<double,3,9,0,3,9>>::operator_
                (in_stack_ffffffffffff9f10,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                  *)in_stack_ffffffffffff9f08);
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::~CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)0xf351fd);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                 in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      in_stack_ffffffffffff9f10 =
           (CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                      in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      local_5d78 = 0x3ff0000000000000;
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff9ee0,
                 in_stack_ffffffffffff9ed8,(Scalar *)SVar7.m_dec,(Scalar *)SVar7.m_rhs);
      X_((Vector3d *)SVar4.m_rhs);
      PVar6 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_ffffffffffff9eb0,
                         (MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)
                         in_stack_ffffffffffff9ea8);
      local_5d08 = PVar6.m_rhs;
      in_stack_ffffffffffff9f08 =
           (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)PVar6.m_lhs;
      local_5d10 = in_stack_ffffffffffff9f08;
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffff9ef0,
                 (Index)in_stack_ffffffffffff9ee8,(Index)in_stack_ffffffffffff9ee0,
                 (int)((ulong)in_stack_ffffffffffff9ed8 >> 0x20),(int)in_stack_ffffffffffff9ed8);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                 in_stack_ffffffffffff9eb0,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
                  *)in_stack_ffffffffffff9ea8);
      in_stack_ffffffffffff9ef8 =
           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                      in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      in_stack_ffffffffffff9ef0 =
           (StorageBaseType *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                      in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      local_5e60 = 0x3ff0000000000000;
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff9ee0,
                 in_stack_ffffffffffff9ed8,(Scalar *)SVar7.m_dec,(Scalar *)SVar7.m_rhs);
      X_((Vector3d *)SVar4.m_rhs);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)SVar7.m_rhs);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
      ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *)SVar7.m_rhs,
                  (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffff9ec0);
      in_stack_ffffffffffff9ee8 =
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                      in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      in_stack_ffffffffffff9ee0 =
           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                      in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      in_stack_ffffffffffff9ed8 =
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                      in_stack_ffffffffffff9eb0,(Index)in_stack_ffffffffffff9ea8);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff9ee0,
                 in_stack_ffffffffffff9ed8,(Scalar *)SVar7.m_dec,(Scalar *)SVar7.m_rhs);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
      ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                   *)SVar7.m_rhs,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffff9ec0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)SVar7.m_dec,
                 (Index)SVar7.m_rhs,(int)((ulong)in_stack_ffffffffffff9ec0 >> 0x20));
      Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)
                 in_stack_ffffffffffff9eb0,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)in_stack_ffffffffffff9ea8);
    }
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::householderQr
              (in_stack_ffffffffffff9eb8);
    SVar7 = Eigen::SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
            solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                      ((SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)in_stack_ffffffffffff9ec0,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_ffffffffffff9eb8);
    local_5ed0 = SVar7;
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffff9eb0,
               (EigenBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)in_stack_ffffffffffff9ea8);
    Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
              ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffff9eb0
              );
    in_stack_ffffffffffff9ec0 = in_R9;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff9eb0,
               &in_stack_ffffffffffff9ea8->v);
    in_stack_ffffffffffff9eb8 = local_5f68;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)SVar7.m_dec,(Index)SVar7.m_rhs,
               (int)((ulong)in_stack_ffffffffffff9ec0 >> 0x20));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff9eb0,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               in_stack_ffffffffffff9ea8);
    in_stack_ffffffffffff9eb0 =
         (PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_5f50;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)SVar7.m_dec,(Index)SVar7.m_rhs,
               (int)((ulong)in_stack_ffffffffffff9ec0 >> 0x20));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff9eb0,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               in_stack_ffffffffffff9ea8);
    in_stack_ffffffffffff9ea8 = (value_type *)(local_5f50 + 0x18);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)SVar7.m_dec,(Index)SVar7.m_rhs,
               (int)((ulong)in_stack_ffffffffffff9ec0 >> 0x20));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff9eb0,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               in_stack_ffffffffffff9ea8);
    local_5f20 = 0x3ff0000000000000;
    local_5f18 = 0.0;
    std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::push_back
              ((vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_> *)
               in_stack_ffffffffffff9eb0,in_stack_ffffffffffff9ea8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xf3570c);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xf35719);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xf35726)
    ;
  }
  Eigen::Matrix<std::complex<double>,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<std::complex<double>,__1,__1,_0,__1,__1> *)0xf357a9);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xf357b6);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xf357c3);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xf357d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xf357dd);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xf357ea);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_ffffffffffff9ec0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xf35804);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xf35811);
  return 0;
}

Assistant:

int r6pSingleLin(const  Eigen::MatrixXd & X, const  Eigen::MatrixXd & u, const Eigen::MatrixXd & ud, int direction, double r0, int maxpow, RSSinglelinCameraPoseVector * results) {
	Eigen::VectorXd coeffs(1260);
	Eigen::MatrixXd CC = Eigen::MatrixXd::Zero(99, 163);

	double solver_input[2475];

	std::vector<Eigen::Vector3d> v;

	if (direction == 0) {
		R6P_cayley_linearized_prepare_data_C(X.data(), u.data(), ud.data(), r0, solver_input);
	}
	else {
		R6P_cayley_linearized_prepare_data_y_C(X.data(), u.data(), ud.data(), r0, solver_input);
	}

	Eigen::Map<Eigen::MatrixXd> data(solver_input, 15, 165);

	for (int j = 0; j < 15; j++)
	{
		data.row(j) /= data.row(j).cwiseAbs().mean();
	}

	computeCoeffs(data, coeffs);
	setupEliminationTemplate(coeffs, CC);

	Eigen::MatrixXd C0 = CC.leftCols(99);
	Eigen::MatrixXd C1 = CC.rightCols(64);
	

	Eigen::MatrixXd alpha = C0.partialPivLu().solve(C1);

	Eigen::MatrixXd RR(85, 64);
	for (int j = 0; j < 21; j++)
	{
		RR.row(j) = -alpha.row(78 + j);
	}


	RR.bottomRows(64) = Eigen::MatrixXd::Identity(64, 64);

	int AM_ind[] = { 78, 55, 40, 32, 28, 0, 1, 2, 31, 3, 4, 33, 5, 38, 37, 6, 7, 39, 8, 41, 42, 43, 9, 51, 49, 48, 10, 11, 50, 12, 52, 53, 54, 13, 56, 57, 58, 59, 14, 73, 69, 66, 65, 15, 16, 67, 68, 17, 70, 71, 72, 18, 74, 75, 76, 77, 19, 79, 80, 81, 82, 83, 84, 20 };
	Eigen::MatrixXd AM(64, 64);
	for (int j = 0; j < 64; j++)
	{
		AM.row(j) = RR.row(AM_ind[j]);
	}

	double p[65];
	charpoly_danilevsky(AM, p);


	int order = 64;
	double proots[65];
	double roots[64];
	int nroots;
	for (int j = 0; j <= order; j++) {
		proots[order - j] = p[j];
	}
	find_real_roots_sturm(proots, order, roots, &nroots, maxpow, 0);


	Eigen::MatrixXcd sols(3, nroots);

	v = solve_xy_from_AM(roots, nroots, AM);


	for (int j = 0; j < nroots; j++)
	{

		Eigen::Matrix3d R;
		Eigen::Vector4d q;
		q(0) = 1;
		q.segment(1, 3) = v[j];
		q.normalize();
		quat2R(q, R);

		Eigen::AngleAxis<double> eaxn = Eigen::AngleAxis<double>(R);

		Eigen::Vector3d eax = eaxn.axis()*eaxn.angle();
		//std::cout << R;
		Eigen::MatrixXd A(18, 9);
		Eigen::VectorXd b(18);
		for (int k = 0; k < 6; k++)
		{
			double dr = u(k * 2 + direction) - r0;
			Eigen::Matrix<double, 3, 9> temp;
			temp << -dr*X_(R*Eigen::Vector3d(X(k * 3), X(k * 3 + 1), X(k * 3 + 2))), Eigen::Matrix3d::Identity(), dr*Eigen::Matrix3d::Identity();

			A.block(k * 3, 0, 3, 9) = X_(Eigen::Vector3d(u(k * 2), u(k * 2 + 1), 1))*temp;

			b.segment(k * 3, 3) = -X_(Eigen::Vector3d(u(k * 2), u(k * 2 + 1), 1))*R*Eigen::Vector3d(X(k * 3), X(k * 3 + 1), X(k * 3 + 2));

		}

		Eigen::VectorXd wCt = A.householderQr().solve(b);


		results->push_back({eax, wCt.segment(3,3), wCt.segment(0,3), wCt.segment(6,3), 1, 0});

	}


	return 0;

}